

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int json_object_update_existing(json_t *object,json_t *other)

{
  void *pvVar1;
  json_t *pjVar2;
  bool bVar3;
  json_t *local_38;
  json_t *value;
  size_t key_len;
  char *key;
  json_t *other_local;
  json_t *object_local;
  
  if ((((object == (json_t *)0x0) || (object->type != JSON_OBJECT)) || (other == (json_t *)0x0)) ||
     (other->type != JSON_OBJECT)) {
    object_local._4_4_ = -1;
  }
  else {
    pvVar1 = json_object_iter(other);
    key_len = (size_t)json_object_iter_key(pvVar1);
    pvVar1 = json_object_key_to_iter((char *)key_len);
    value = (json_t *)json_object_iter_key_len(pvVar1);
    while( true ) {
      bVar3 = false;
      if (key_len != 0) {
        pvVar1 = json_object_key_to_iter((char *)key_len);
        local_38 = json_object_iter_value(pvVar1);
        bVar3 = local_38 != (json_t *)0x0;
      }
      if (!bVar3) break;
      pjVar2 = json_object_getn(object,(char *)key_len,(size_t)value);
      if (pjVar2 != (json_t *)0x0) {
        json_object_setn_nocheck(object,(char *)key_len,(size_t)value,local_38);
      }
      pvVar1 = json_object_key_to_iter((char *)key_len);
      pvVar1 = json_object_iter_next(other,pvVar1);
      key_len = (size_t)json_object_iter_key(pvVar1);
      pvVar1 = json_object_key_to_iter((char *)key_len);
      value = (json_t *)json_object_iter_key_len(pvVar1);
    }
    object_local._4_4_ = 0;
  }
  return object_local._4_4_;
}

Assistant:

int json_object_update_existing(json_t *object, json_t *other) {
    const char *key;
    size_t key_len;
    json_t *value;

    if (!json_is_object(object) || !json_is_object(other))
        return -1;

    json_object_keylen_foreach(other, key, key_len, value) {
        if (json_object_getn(object, key, key_len))
            json_object_setn_nocheck(object, key, key_len, value);
    }

    return 0;
}